

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cc
# Opt level: O0

void __thiscall t_callback_library::f_scan(t_callback_library *this,t_scan a_scan)

{
  t_object *ptVar1;
  t_scan a_scan_local;
  t_callback_library *this_local;
  
  ptVar1 = xemmai::t_slot::operator_cast_to_t_object_(&this->v_symbol_on_message);
  (*a_scan)(ptVar1);
  ptVar1 = xemmai::t_slot_of::operator_cast_to_t_object_((t_slot_of *)&this->v_type_client);
  (*a_scan)(ptVar1);
  ptVar1 = xemmai::t_slot_of::operator_cast_to_t_object_((t_slot_of *)&this->v_type_server);
  (*a_scan)(ptVar1);
  return;
}

Assistant:

void t_callback_library::f_scan(t_scan a_scan)
{
	a_scan(v_symbol_on_message);
	a_scan(v_type_client);
	a_scan(v_type_server);
}